

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall Not::Not(Not *this,shared_ptr<Token> *t,shared_ptr<Expr> *x2)

{
  element_type *peVar1;
  shared_ptr<Type> local_90;
  shared_ptr<Type> local_80;
  shared_ptr<Type> local_70 [2];
  shared_ptr<Expr> local_50;
  shared_ptr<Expr> local_40;
  shared_ptr<Token> local_30;
  shared_ptr<Expr> *local_20;
  shared_ptr<Expr> *x2_local;
  shared_ptr<Token> *t_local;
  Not *this_local;
  
  local_20 = x2;
  x2_local = (shared_ptr<Expr> *)t;
  t_local = (shared_ptr<Token> *)this;
  std::shared_ptr<Token>::shared_ptr(&local_30,t);
  std::shared_ptr<Expr>::shared_ptr(&local_40,x2);
  std::shared_ptr<Expr>::shared_ptr(&local_50,x2);
  Logical::Logical(&this->super_Logical,&local_30,&local_40,&local_50);
  std::shared_ptr<Expr>::~shared_ptr(&local_50);
  std::shared_ptr<Expr>::~shared_ptr(&local_40);
  std::shared_ptr<Token>::~shared_ptr(&local_30);
  (this->super_Logical).super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR_toJson_abi_cxx11__0016f1a0;
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)x2);
  std::shared_ptr<Type>::shared_ptr(&local_80,&peVar1->type);
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)x2);
  std::shared_ptr<Type>::shared_ptr(&local_90,&peVar1->type);
  (*(this->super_Logical).super_Expr.super_Node._vptr_Node[7])(local_70,this,&local_80,&local_90);
  std::shared_ptr<Type>::operator=(&(this->super_Logical).super_Expr.type,local_70);
  std::shared_ptr<Type>::~shared_ptr(local_70);
  std::shared_ptr<Type>::~shared_ptr(&local_90);
  std::shared_ptr<Type>::~shared_ptr(&local_80);
  return;
}

Assistant:

Not(std::shared_ptr<Token> t,  std::shared_ptr<Expr> x2) : Logical(t, x2, x2) {
		type = check(x2->type, x2->type);
	}